

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_refs_pushptr(MTBDD *ptr)

{
  undefined8 *puVar1;
  long *in_FS_OFFSET;
  MTBDD *ptr_local;
  
  if (*(long *)(*in_FS_OFFSET + -0x18) == 0) {
    mtbdd_refs_init_key();
    mtbdd_refs_pushptr(ptr);
  }
  else {
    puVar1 = *(undefined8 **)(*(long *)(*in_FS_OFFSET + -0x18) + 0x10);
    *(undefined8 **)(*(long *)(*in_FS_OFFSET + -0x18) + 0x10) = puVar1 + 1;
    *puVar1 = ptr;
    if (*(long *)(*(long *)(*in_FS_OFFSET + -0x18) + 0x10) ==
        *(long *)(*(long *)(*in_FS_OFFSET + -0x18) + 8)) {
      mtbdd_refs_ptrs_up(*(mtbdd_refs_internal_t *)(*in_FS_OFFSET + -0x18));
    }
  }
  return;
}

Assistant:

void __attribute__((unused))
mtbdd_refs_pushptr(const MTBDD *ptr)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    if (mtbdd_refs_key == 0) {
        mtbdd_refs_init_key();
        mtbdd_refs_pushptr(ptr);
    } else {
        *mtbdd_refs_key->pcur++ = ptr;
        if (mtbdd_refs_key->pcur == mtbdd_refs_key->pend) mtbdd_refs_ptrs_up(mtbdd_refs_key);
    }
}